

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

bool __thiscall
duckdb::StrpTimeFormat::TryParseTimestamp
          (StrpTimeFormat *this,char *data,size_t size,timestamp_t *result)

{
  bool bVar1;
  ParseResult *in_RDI;
  ParseResult parse_result;
  undefined1 in_stack_0000033f;
  ParseResult *in_stack_00000340;
  size_t in_stack_00000348;
  char *in_stack_00000350;
  StrpTimeFormat *in_stack_00000358;
  ParseResult *in_stack_ffffffffffffff60;
  ParseResult *in_stack_ffffffffffffff68;
  undefined1 local_1;
  
  ParseResult::ParseResult(in_stack_ffffffffffffff60);
  bVar1 = Parse(in_stack_00000358,in_stack_00000350,in_stack_00000348,in_stack_00000340,
                (bool)in_stack_0000033f);
  if (bVar1) {
    local_1 = ParseResult::TryToTimestamp
                        (in_stack_ffffffffffffff68,(timestamp_t *)in_stack_ffffffffffffff60);
  }
  else {
    local_1 = false;
  }
  ParseResult::~ParseResult(in_RDI);
  return local_1;
}

Assistant:

bool StrpTimeFormat::TryParseTimestamp(const char *data, size_t size, timestamp_t &result) const {
	ParseResult parse_result;
	if (!Parse(data, size, parse_result)) {
		return false;
	}
	return parse_result.TryToTimestamp(result);
}